

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

bool baryonyx::itm::
     is_valid_constraint<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
               (solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                *slv,int k,bit_array *x)

{
  unsigned_long *puVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  long in_R8;
  undefined1 auVar8 [16];
  undefined1 auVar10 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  int iVar17;
  undefined1 auVar18 [64];
  undefined1 local_30 [16];
  undefined1 auVar9 [32];
  undefined1 auVar11 [32];
  
  sparse_matrix<int>::row((sparse_matrix<int> *)local_30,(int)slv + 0x10);
  if (local_30._8_8_ == local_30._0_8_) {
    iVar17 = 0;
  }
  else {
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
    auVar11._8_4_ = 0xffffffc0;
    auVar11._0_8_ = 0xffffffc0ffffffc0;
    auVar11._12_4_ = 0xffffffc0;
    auVar11._16_4_ = 0xffffffc0;
    auVar11._20_4_ = 0xffffffc0;
    auVar11._24_4_ = 0xffffffc0;
    auVar11._28_4_ = 0xffffffc0;
    auVar13 = vpbroadcastq_avx512f(ZEXT816(1));
    lVar6 = local_30._0_8_ - local_30._8_8_;
    puVar1 = (x->super_bit_array_impl).m_data._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    uVar7 = 0;
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpsrlq_avx512f(auVar14,3);
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar18 = auVar14;
      auVar14 = vpbroadcastq_avx512f();
      uVar7 = uVar7 + 8;
      auVar14 = vporq_avx512f(auVar14,auVar12);
      uVar4 = vpcmpuq_avx512f(auVar14,auVar15,2);
      auVar9 = vpgatherdd_avx512vl(*(undefined4 *)(local_30._8_8_ + (long)puVar1 + 4));
      bVar2 = (byte)uVar4;
      auVar10._4_4_ = (uint)((byte)(uVar4 >> 1) & 1) * auVar9._4_4_;
      auVar10._0_4_ = (uint)(bVar2 & 1) * auVar9._0_4_;
      auVar10._8_4_ = (uint)((byte)(uVar4 >> 2) & 1) * auVar9._8_4_;
      auVar10._12_4_ = (uint)((byte)(uVar4 >> 3) & 1) * auVar9._12_4_;
      auVar10._16_4_ = (uint)((byte)(uVar4 >> 4) & 1) * auVar9._16_4_;
      auVar10._20_4_ = (uint)((byte)(uVar4 >> 5) & 1) * auVar9._20_4_;
      auVar10._24_4_ = (uint)((byte)(uVar4 >> 6) & 1) * auVar9._24_4_;
      auVar10._28_4_ = (uint)(byte)(uVar4 >> 7) * auVar9._28_4_;
      local_30._8_8_ = local_30._8_8_ + 0x40;
      auVar9 = vpsrad_avx2(auVar10,0x1f);
      auVar9 = vpsrld_avx2(auVar9,0x1a);
      auVar9 = vpaddd_avx2(auVar10,auVar9);
      vpsrad_avx2(auVar9,6);
      auVar9 = vpand_avx2(auVar9,auVar11);
      auVar9 = vpsubd_avx2(auVar10,auVar9);
      auVar14 = vpgatherdq_avx512f((int)puVar1[in_R8]);
      auVar16._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar14._8_8_;
      auVar16._0_8_ = (ulong)(bVar2 & 1) * auVar14._0_8_;
      auVar16._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar14._16_8_;
      auVar16._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar14._24_8_;
      auVar16._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar14._32_8_;
      auVar16._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar14._40_8_;
      auVar16._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar14._48_8_;
      auVar16._56_8_ = (uVar4 >> 7) * auVar14._56_8_;
      auVar14 = vpmovzxdq_avx512f(auVar9);
      auVar14 = vpsrlvq_avx512f(auVar16,auVar14);
      uVar5 = vptestmq_avx512f(auVar14,auVar13);
      auVar9 = vpmovm2d_avx512vl(uVar5);
      auVar9 = vpsubd_avx2(auVar18._0_32_,auVar9);
      auVar14 = ZEXT3264(auVar9);
    } while (((lVar6 - 8U >> 3) + 8 & 0xfffffffffffffff8) != uVar7);
    auVar11 = vmovdqa32_avx512vl(auVar9);
    auVar8._0_4_ = (uint)(bVar2 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar18._0_4_;
    bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
    auVar8._4_4_ = (uint)bVar3 * auVar11._4_4_ | (uint)!bVar3 * auVar18._4_4_;
    bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
    auVar8._8_4_ = (uint)bVar3 * auVar11._8_4_ | (uint)!bVar3 * auVar18._8_4_;
    bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
    auVar8._12_4_ = (uint)bVar3 * auVar11._12_4_ | (uint)!bVar3 * auVar18._12_4_;
    bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
    auVar9._16_4_ = (uint)bVar3 * auVar11._16_4_ | (uint)!bVar3 * auVar18._16_4_;
    auVar9._0_16_ = auVar8;
    bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
    auVar9._20_4_ = (uint)bVar3 * auVar11._20_4_ | (uint)!bVar3 * auVar18._20_4_;
    bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
    auVar9._24_4_ = (uint)bVar3 * auVar11._24_4_ | (uint)!bVar3 * auVar18._24_4_;
    bVar3 = SUB81(uVar4 >> 7,0);
    auVar9._28_4_ = (uint)bVar3 * auVar11._28_4_ | (uint)!bVar3 * auVar18._28_4_;
    auVar8 = vphaddd_avx(auVar9._16_16_,auVar8);
    auVar8 = vphaddd_avx(auVar8,auVar8);
    auVar8 = vphaddd_avx(auVar8,auVar8);
    iVar17 = auVar8._0_4_;
  }
  return iVar17 == (slv->b)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[k];
}

Assistant:

bool
is_valid_constraint(const Solver& slv, int k, const Xtype& x)
{
    typename sparse_matrix<int>::const_row_iterator it, et;

    std::tie(it, et) = slv.ap.row(k);
    int v = 0;

    for (; it != et; ++it)
        v += slv.factor(it->value) * x[it->column];

    return slv.bound_min(k) <= v && v <= slv.bound_max(k);
}